

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void __thiscall
gimage::TIFFImageIO::loadHeader(TIFFImageIO *this,char *name,long *width,long *height,int *depth)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong *in_RCX;
  ulong *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  uint *in_R8;
  uint16_t d;
  uint32_t h;
  uint32_t w;
  TIFF *tif;
  ushort local_b2;
  uint local_b0;
  uint local_ac;
  undefined1 local_a5;
  string *in_stack_ffffffffffffff68;
  IOException *in_stack_ffffffffffffff70;
  
  lVar1 = TIFFOpen(in_RSI,"r");
  if (lVar1 == 0) {
    local_a5 = 1;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,(char *)in_RSI,
               (allocator *)&stack0xffffffffffffff6f);
    std::operator+((char *)in_RSI,__rhs);
    std::operator+(in_RSI,(char *)__rhs);
    gutil::IOException::IOException(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_a5 = 0;
    __cxa_throw(__rhs,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  TIFFGetField(lVar1,0x100,&local_ac);
  TIFFGetField(lVar1,0x101,&local_b0);
  TIFFGetField(lVar1,0x115,&local_b2);
  *in_RDX = (ulong)local_ac;
  *in_RCX = (ulong)local_b0;
  *in_R8 = (uint)local_b2;
  TIFFClose(lVar1);
  return;
}

Assistant:

void TIFFImageIO::loadHeader(const char *name, long &width, long &height, int &depth) const
{
  TIFF *tif=TIFFOpen(name, "r");

  if (tif == 0)
  {
    throw gutil::IOException("Can only load TIFF image ("+std::string(name)+")");
  }

  uint32_t w, h;
  uint16_t d;

  TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &w);
  TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &h);
  TIFFGetField(tif, TIFFTAG_SAMPLESPERPIXEL, &d);

  width=w;
  height=h;
  depth=d;

  TIFFClose(tif);
}